

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

ssize_t __thiscall Corrade::Utility::Path::write(Path *this,int __fd,void *__buf,size_t __n)

{
  char *__filename;
  FILE *__s;
  undefined8 extraout_RAX;
  Debug *pDVar1;
  int *piVar2;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  StringView view;
  StringView value;
  ScopeGuard exit;
  
  view._sizePlusFlags = __n;
  view._data = (char *)CONCAT44(in_register_00000034,__fd);
  Containers::String::nullTerminatedView((String *)&exit,(String *)this,view);
  __filename = Containers::String::data((String *)&exit);
  __s = fopen(__filename,"wb");
  Containers::String::~String((String *)&exit);
  if (__s == (FILE *)0x0) {
    Error::Error((Error *)&exit,(Flags)0x0);
    pDVar1 = Debug::operator<<((Debug *)&exit,"Utility::Path::write(): can\'t open");
    value._sizePlusFlags = (size_t)CONCAT44(in_register_00000034,__fd);
    value._data = (char *)this;
    pDVar1 = Debug::operator<<(pDVar1,value);
    (pDVar1->_immediateFlags)._value = (pDVar1->_immediateFlags)._value | 4;
    Debug::operator<<(pDVar1,":");
    piVar2 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)&exit,*piVar2);
    Error::~Error((Error *)&exit);
    uVar3 = extraout_RAX_00;
  }
  else {
    exit._deleter = fclose;
    exit._deleterWrapper =
         Containers::ScopeGuard::ScopeGuard<_IO_FILE_*,_int_(*)(_IO_FILE_*)>::
         anon_class_1_0_00000001::__invoke;
    exit._handle = __s;
    fwrite(__buf,1,__n,__s);
    Containers::ScopeGuard::~ScopeGuard(&exit);
    uVar3 = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)uVar3 >> 8),__s != (FILE *)0x0);
}

Assistant:

bool write(const Containers::StringView filename, const Containers::ArrayView<const void> data) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "wb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"wb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::write(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return false;
    }

    Containers::ScopeGuard exit{f, std::fclose};

    std::fwrite(data, 1, data.size(), f);
    return true;
}